

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

bool __thiscall flatbuffers::dart::DartGenerator::generate(DartGenerator *this)

{
  size_t *__lhs;
  bool bVar1;
  __type _Var2;
  char cVar3;
  ulong uVar4;
  pointer ppVar5;
  pointer __rhs;
  char *pcVar6;
  string local_328;
  string local_308;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  _Self local_248;
  _Self local_240;
  iterator kv2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  _Self local_138;
  _Self local_130;
  iterator kv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string local_100 [8];
  string import_code;
  IncludedFile *included_file;
  iterator __end2;
  iterator __begin2;
  vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  imports;
  undefined1 local_68 [8];
  namespace_code_map namespace_code;
  string code;
  DartGenerator *this_local;
  
  std::__cxx11::string::string
            ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_68);
  GenerateEnums(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_68);
  GenerateStructs(this,(namespace_code_map *)local_68);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range2);
  Parser::GetIncludedFiles
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             &__begin2,(this->super_BaseGenerator).parser_);
  __end2 = std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::begin
                     ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>
                       *)&__begin2);
  included_file =
       (IncludedFile *)
       std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::end
                 ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
                  &__begin2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>
                                     *)&included_file), bVar1) {
    import_code.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>
         ::operator*(&__end2);
    _Var2 = std::operator==(&((reference)import_code.field_2._8_8_)->filename,
                            &((this->super_BaseGenerator).parser_)->file_being_parsed_);
    if (!_Var2) {
      import_generator<flatbuffers::StructDef>
                (this,&(((this->super_BaseGenerator).parser_)->structs_).vec,
                 (string *)(import_code.field_2._8_8_ + 0x20),
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
      import_generator<flatbuffers::EnumDef>
                (this,&(((this->super_BaseGenerator).parser_)->enums_).vec,
                 (string *)(import_code.field_2._8_8_ + 0x20),
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::IncludedFile_*,_std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>_>
    ::operator++(&__end2);
  }
  std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::~vector
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             &__begin2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"",(allocator<char> *)((long)&__range2_1 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
  __end2_1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
  file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2);
  while (bVar1 = std::operator!=(&__end2_1,(_Self *)&file), bVar1) {
    kv._M_node = (_Base_ptr)
                 std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2_1);
    std::__cxx11::string::operator+=(local_100,(string *)kv._M_node);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2_1);
  }
  cVar3 = std::__cxx11::string::empty();
  pcVar6 = "\n";
  if (cVar3 != '\0') {
    pcVar6 = "";
  }
  std::__cxx11::string::operator+=(local_100,pcVar6);
  local_130._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_68);
  do {
    local_138._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_68);
    bVar1 = std::operator!=(&local_130,&local_138);
    if (!bVar1) {
      this_local._7_1_ = true;
LAB_00238659:
      std::__cxx11::string::~string(local_100);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_68);
      std::__cxx11::string::~string
                ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return this_local._7_1_;
    }
    std::__cxx11::string::clear();
    std::operator+(&local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,"// ");
    pcVar6 = BaseGenerator::FlatBuffersGeneratedWarning();
    std::operator+(&local_178,&local_198,pcVar6);
    std::operator+(&local_158,&local_178,"\n");
    __lhs = &namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::__cxx11::string::operator=((string *)__lhs,(string *)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::operator+(&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   "// ignore_for_file: unused_import, unused_field, unused_element, unused_local_variable\n\n"
                  );
    std::__cxx11::string::operator=
              ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_130);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_130);
      std::operator+(&local_1f8,"library ",&ppVar5->first);
      std::operator+(&local_1d8,&local_1f8,";\n\n");
      std::__cxx11::string::operator+=
                ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    std::__cxx11::string::operator+=
              ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "import \'dart:typed_data\' show Uint8List;\n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&kv2,
                   "import \'package:flat_buffers/flat_buffers.dart\' as ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _kFb_abi_cxx11_);
    std::operator+(&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&kv2,";\n\n"
                  );
    std::__cxx11::string::operator+=
              ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&kv2);
    local_240._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_68);
    while( true ) {
      local_248._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_68);
      bVar1 = std::operator!=(&local_240,&local_248);
      if (!bVar1) break;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_240);
      __rhs = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator->(&local_130);
      bVar1 = std::operator!=(&ppVar5->first,&__rhs->first);
      if (bVar1) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_240);
        Filename(&local_2e8,this,&ppVar5->first,false);
        std::operator+(&local_2c8,"import \'./",&local_2e8);
        std::operator+(&local_2a8,&local_2c8,"\' as ");
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_240);
        ImportAliasName(&local_308,&ppVar5->first);
        std::operator+(&local_288,&local_2a8,&local_308);
        std::operator+(&local_268,&local_288,";\n");
        std::__cxx11::string::operator+=
                  ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&local_240);
    }
    std::__cxx11::string::operator+=
              ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,"\n");
    std::__cxx11::string::operator+=
              ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,local_100)
    ;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_130);
    std::__cxx11::string::operator+=
              ((string *)&namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)&ppVar5->second);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_130);
    Filename(&local_328,this,&ppVar5->first,true);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar1 = SaveFile(pcVar6,(string *)
                            &namespace_code._M_t._M_impl.super__Rb_tree_header._M_node_count,false);
    std::__cxx11::string::~string((string *)&local_328);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_00238659;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_130);
  } while( true );
}

Assistant:

bool generate() {
    std::string code;
    namespace_code_map namespace_code;
    GenerateEnums(namespace_code);
    GenerateStructs(namespace_code);

    std::set<std::string> imports;

    for (const auto &included_file : parser_.GetIncludedFiles()) {
      if (included_file.filename == parser_.file_being_parsed_) continue;

      import_generator(parser_.structs_.vec, included_file.filename, imports);
      import_generator(parser_.enums_.vec, included_file.filename, imports);
    }

    std::string import_code = "";
    for (const auto &file : imports) { import_code += file; }

    import_code += import_code.empty() ? "" : "\n";

    for (auto kv = namespace_code.begin(); kv != namespace_code.end(); ++kv) {
      code.clear();
      code = code + "// " + FlatBuffersGeneratedWarning() + "\n";
      code = code +
             "// ignore_for_file: unused_import, unused_field, unused_element, "
             "unused_local_variable\n\n";

      if (!kv->first.empty()) { code += "library " + kv->first + ";\n\n"; }

      code += "import 'dart:typed_data' show Uint8List;\n";
      code += "import 'package:flat_buffers/flat_buffers.dart' as " + _kFb +
              ";\n\n";

      for (auto kv2 = namespace_code.begin(); kv2 != namespace_code.end();
           ++kv2) {
        if (kv2->first != kv->first) {
          code += "import './" + Filename(kv2->first, /*path=*/false) +
                  "' as " + ImportAliasName(kv2->first) + ";\n";
        }
      }

      code += "\n";
      code += import_code;

      code += kv->second;

      if (!SaveFile(Filename(kv->first).c_str(), code, false)) { return false; }
    }
    return true;
  }